

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateDynamicMethodMakeImmutable
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  ImmutableFieldLiteGenerator *pIVar2;
  long lVar3;
  int i;
  long lVar4;
  
  lVar3 = 0;
  for (lVar4 = 0; pDVar1 = (this->super_MessageGenerator).descriptor_,
      lVar4 < *(int *)(pDVar1 + 0x2c); lVar4 = lVar4 + 1) {
    pIVar2 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&this->field_generators_,
                        (FieldDescriptor *)(*(long *)(pDVar1 + 0x30) + lVar3));
    (*pIVar2->_vptr_ImmutableFieldLiteGenerator[9])(pIVar2,printer);
    lVar3 = lVar3 + 0xa8;
  }
  io::Printer::Print(printer,"return null;\n");
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodMakeImmutable(
    io::Printer* printer) {

  // Output generation code for each field.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
        .GenerateDynamicMethodMakeImmutableCode(printer);
  }

  printer->Print(
    "return null;\n");
}